

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_reporter.c
# Opt level: O2

void text_reporter_print_results
               (char *buf,char *prepend,int passes,int failures,int skips,int exceptions,
               uint32_t duration,_Bool use_colors)

{
  undefined1 *__src;
  
  __sprintf_chk(buf,1,0xffffffffffffffff,"%s",prepend);
  if (((failures == 0 && passes == 0) && skips == 0) && exceptions == 0) {
    __src = "No assertions";
  }
  else {
    if (passes != 0) {
      format_count(format_passes_buff,passes,"pass","\x1b[32m","es",use_colors);
      strcat(buf,format_passes_buff);
    }
    if (skips != 0) {
      insert_comma(buf);
      format_count(format_skips_buff,skips,"skipped","\x1b[33m","",use_colors);
      strcat(buf,format_skips_buff);
    }
    if (failures != 0) {
      insert_comma(buf);
      format_count(format_failures_buff,failures,"failure","\x1b[31m","s",use_colors);
      strcat(buf,format_failures_buff);
    }
    if (exceptions != 0) {
      insert_comma(buf);
      format_count(format_exceptions_buff,exceptions,"exception","\x1b[35m","s",use_colors);
      strcat(buf,format_exceptions_buff);
    }
    __src = format_duration_buff;
    __snprintf_chk(format_duration_buff,100,1,100," in %dms",duration);
  }
  strcat(buf,__src);
  return;
}

Assistant:

static void text_reporter_print_results(char *buf, char *prepend,
    int passes, int failures, int skips, int exceptions, uint32_t duration,
    bool use_colors) {

    sprintf(buf, "%s", prepend);
    if (passes || failures || skips || exceptions) {
        if (passes)
            strcat(buf, format_passes(passes, use_colors));
        if (skips) {
            insert_comma(buf);
            strcat(buf, format_skips(skips, use_colors));
        }
        if (failures) {
            insert_comma(buf);
            strcat(buf, format_failures(failures, use_colors));
        }
        if (exceptions) {
            insert_comma(buf);
            strcat(buf, format_exceptions(exceptions, use_colors));
        }
        strcat(buf, format_duration(duration));
    } else {
        strcat(buf, "No assertions");
    }
}